

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O1

void __thiscall
bal::VariableTextReader::read_variable_element_hex_
          (VariableTextReader *this,Container<unsigned_int> *value)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  _func_int *p_Var4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  string local_50;
  
  uVar3 = *(ulong *)(&this->field_0x10 + (long)this->_vptr_VariableTextReader[-3]);
  if (0x3ffffffe < uVar3 - 3 >> 2) {
    __assert_fail("token_len > 2 && token_len <= CONTAINER_SIZE_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesio.cpp"
                  ,0xad,
                  "void bal::VariableTextReader::read_variable_element_hex_(Container<literalid_t> &)"
                 );
  }
  iVar11 = (int)uVar3 * 4 + -8;
  uVar2 = value->allocated_size_;
  uVar10 = value->size_ + iVar11;
  if ((uVar2 < uVar10) && (uVar10 = uVar10 + (uVar2 >> 1), uVar2 != uVar10)) {
    puVar7 = value->data_;
    if (puVar7 == (uint *)0x0) {
      if (uVar10 != 0) {
        puVar7 = (uint *)malloc((ulong)uVar10 << 2);
        value->data_ = puVar7;
        if (puVar7 == (uint *)0x0) {
          __assert_fail("data_ != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                        ,0x37,
                        "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                       );
        }
      }
      value->size_ = 0;
    }
    else if (uVar10 == 0) {
      free(puVar7);
      value->data_ = (uint *)0x0;
      value->size_ = 0;
    }
    else {
      puVar7 = (uint *)realloc(puVar7,(ulong)uVar10 << 2);
      if (puVar7 == (uint *)0x0) {
        __assert_fail("new_data != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                      ,0x32,
                      "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                     );
      }
      value->data_ = puVar7;
    }
    value->allocated_size_ = uVar10;
  }
  p_Var4 = this->_vptr_VariableTextReader[-3];
  lVar5 = *(long *)(&this->field_0x8 + (long)p_Var4);
  lVar6 = *(long *)(&this->field_0x18 + (long)p_Var4);
  puVar7 = value->data_ + value->size_;
  if (*(char *)(lVar6 + lVar5) == '-') {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Negative hexadecimal values not supported","");
    TextReader::parse_error
              ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var4),&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (2 < uVar3) {
    uVar8 = 2;
    do {
      cVar1 = *(char *)(lVar6 + lVar5 + uVar8);
      if (cVar1 < 'A') {
        bVar9 = cVar1 - 0x30;
      }
      else {
        bVar9 = cVar1 + 0xa9;
      }
      *puVar7 = bVar9 >> 3 & 1;
      puVar7[1] = bVar9 >> 2 & 1;
      puVar7[2] = bVar9 >> 1 & 1;
      puVar7[3] = bVar9 & 1;
      puVar7 = puVar7 + 4;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  value->size_ = value->size_ + iVar11;
  p_Var4 = this->_vptr_VariableTextReader[-3];
  *(long *)(&this->field_0x8 + (long)p_Var4) =
       *(long *)(&this->field_0x8 + (long)p_Var4) + *(long *)(&this->field_0x10 + (long)p_Var4);
  *(undefined8 *)(&this->field_0x10 + (long)p_Var4) = 0;
  *(undefined4 *)(&this->field_0x40 + (long)p_Var4) = 0;
  return;
}

Assistant:

inline void VariableTextReader::read_variable_element_hex_(Container<literalid_t>& value) {
        size_t token_len = get_current_token_len();
        assert(token_len > 2 && token_len <= CONTAINER_SIZE_MAX); // prefix
        const container_size_t value_size = ((container_size_t)token_len - 2) << 2;
        value.reserve(value_size);
        
        literalid_t* p_current = value.data_ + value.size_;
        const char* const token = get_current_token();
        
        if (token[0] == '-') {
            parse_error("Negative hexadecimal values not supported");
        };
        
        for (auto i = 2; i < token_len; i++) {
            char h = _hex_value(token[i]);
            p_current[0] = literal_t__constant(h & 0b1000);
            p_current[1] = literal_t__constant(h & 0b0100);
            p_current[2] = literal_t__constant(h & 0b0010);
            p_current[3] = literal_t__constant(h & 0b0001);
            p_current += 4;
        };
        
        value.size_ += value_size;
        skip_token();
    }